

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

_Bool stumpless_element_has_param(stumpless_element *element,char *name)

{
  stumpless_param *param;
  _Bool _Var1;
  int iVar2;
  char *message;
  ulong uVar3;
  size_t name_length;
  size_t local_30;
  
  if (element == (stumpless_element *)0x0) {
    message = "element was NULL";
  }
  else {
    if (name != (char *)0x0) {
      _Var1 = validate_param_name(name,&local_30);
      if (!_Var1) {
        return false;
      }
      clear_error();
      pthread_lock_mutex((pthread_mutex_t *)element->mutex);
      if (element->param_count != 0) {
        uVar3 = 0;
        do {
          param = element->params[uVar3];
          lock_param(param);
          iVar2 = strcmp(param->name,name);
          unlock_param(param);
          if (iVar2 == 0) {
            pthread_unlock_mutex((pthread_mutex_t *)element->mutex);
            return true;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < element->param_count);
      }
      pthread_unlock_mutex((pthread_mutex_t *)element->mutex);
      return false;
    }
    message = "name was NULL";
  }
  raise_argument_empty(message);
  return false;
}

Assistant:

bool
stumpless_element_has_param( const struct stumpless_element *element,
                             const char *name ) {
  size_t name_length;
  size_t i;
  const struct stumpless_param *param;
  int cmp_result;

  if( !element ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "element" ) );
    return false;
  }

  if( !name ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "name" ) );
    return false;
  }

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return false;
  }

  clear_error(  );
  lock_element( element );
  FOR_EACH_PARAM_WITH_NAME( element, name )
    unlock_element( element );
    return true;
  }